

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token slang::parsing::Lexer::stringify
                (Lexer *parentLexer,Token startToken,
                span<slang::parsing::Token,_18446744073709551615UL> bodyTokens,Token endToken)

{
  span<char,_18446744073709551615UL> text_00;
  Token cur_00;
  Token cur_01;
  Token TVar1;
  bool bVar2;
  int iVar3;
  reference pTVar5;
  BufferID BVar4;
  undefined4 extraout_var;
  const_pointer pvVar6;
  SourceLocation SVar7;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *src;
  Info *extraout_RDX;
  TokenKind in_SI;
  undefined8 *in_RDI;
  string_view sVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  string_view sVar10;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar11;
  basic_string_view<char,_std::char_traits<char>_> bVar12;
  Token token;
  Lexer lexer;
  Diagnostics unused;
  string_view raw;
  bool nestedHasTriple;
  string_view raw_1;
  Token cur;
  iterator __end2;
  iterator __begin2;
  span<slang::parsing::Token,_18446744073709551615UL> *__range2;
  anon_class_16_2_0e293a20 addTrivia;
  bool tripleQuoted;
  SmallVector<char,_40UL> text;
  LexerOptions *in_stack_fffffffffffff8c8;
  LexerOptions *in_stack_fffffffffffff8d0;
  Lexer *this;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff8d8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff8e0;
  size_type in_stack_fffffffffffff8e8;
  Token *in_stack_fffffffffffff8f0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff900;
  size_t in_stack_fffffffffffff908;
  anon_class_16_2_0e293a20 *in_stack_fffffffffffff910;
  __fn *__fn;
  BumpAllocator *in_stack_fffffffffffff918;
  Info *in_stack_fffffffffffff920;
  Lexer *in_stack_fffffffffffff928;
  size_t in_stack_fffffffffffff930;
  BufferID bufferId;
  undefined4 in_stack_fffffffffffff950;
  Token local_5f8 [5];
  string_view local_5a8;
  uint32_t local_594;
  undefined8 local_1b0;
  string_view local_1a0;
  undefined1 local_18c;
  undefined1 local_18b;
  undefined1 local_18a;
  undefined1 local_189;
  string_view local_178;
  basic_string_view<char,_std::char_traits<char>_> local_168;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  byte local_f1;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  undefined1 local_da;
  undefined1 local_d9;
  undefined8 local_d8;
  Info *pIStack_d0;
  undefined8 local_c8;
  Info *pIStack_c0;
  Token *local_b8;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  local_b0;
  undefined1 *local_a8;
  byte *local_a0;
  SmallVectorBase<char> *local_98;
  undefined1 local_8f;
  undefined1 local_8e;
  byte local_8d [20];
  undefined1 local_79;
  SmallVectorBase<char> local_78 [2];
  undefined8 *local_38;
  undefined1 local_30 [16];
  Token local_20;
  undefined8 local_10;
  Info *local_8;
  
  local_38 = in_RDI;
  local_20.kind = in_SI;
  SmallVector<char,_40UL>::SmallVector((SmallVector<char,_40UL> *)0x67b574);
  local_79 = 0x22;
  SmallVectorBase<char>::push_back
            ((SmallVectorBase<char> *)in_stack_fffffffffffff8d0,(char *)in_stack_fffffffffffff8c8);
  local_8d[0] = local_20.kind == MacroTripleQuote;
  if ((bool)local_8d[0]) {
    local_8e = 0x22;
    SmallVectorBase<char>::push_back
              ((SmallVectorBase<char> *)in_stack_fffffffffffff8d0,(char *)in_stack_fffffffffffff8c8)
    ;
    local_8f = 0x22;
    SmallVectorBase<char>::push_back
              ((SmallVectorBase<char> *)in_stack_fffffffffffff8d0,(char *)in_stack_fffffffffffff8c8)
    ;
  }
  local_a0 = local_8d;
  local_98 = local_78;
  local_a8 = local_30;
  local_b0._M_current =
       (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::begin
                          ((span<slang::parsing::Token,_18446744073709551615UL> *)
                           in_stack_fffffffffffff8c8);
  local_b8 = (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::end
                                ((span<slang::parsing::Token,_18446744073709551615UL> *)
                                 in_stack_fffffffffffff8d8);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffff8d0,
                       (__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffff8c8);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pTVar5 = __gnu_cxx::
             __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
             ::operator*(&local_b0);
    local_d8._0_2_ = pTVar5->kind;
    local_d8._2_1_ = pTVar5->field_0x2;
    local_d8._3_1_ = pTVar5->numFlags;
    local_d8._4_4_ = pTVar5->rawLen;
    pIStack_d0 = pTVar5->info;
    cur_00.info = in_stack_fffffffffffff920;
    cur_00._0_8_ = in_stack_fffffffffffff918;
    local_c8 = local_d8;
    pIStack_c0 = pIStack_d0;
    stringify::anon_class_16_2_0e293a20::operator()(in_stack_fffffffffffff910,cur_00);
    if ((short)local_c8 == 0x15c) {
      local_d9 = 0x5c;
      SmallVectorBase<char>::push_back
                ((SmallVectorBase<char> *)in_stack_fffffffffffff8d0,
                 (char *)in_stack_fffffffffffff8c8);
      local_da = 0x22;
      SmallVectorBase<char>::push_back
                ((SmallVectorBase<char> *)in_stack_fffffffffffff8d0,
                 (char *)in_stack_fffffffffffff8c8);
    }
    else if ((short)local_c8 == 4) {
      sVar8 = Token::rawText((Token *)in_stack_fffffffffffff8e0._M_extent_value);
      local_f0 = sVar8;
      local_108 = sv((char *)in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
      bVar12._M_str = (char *)in_stack_fffffffffffff910;
      bVar12._M_len = in_stack_fffffffffffff908;
      local_f1 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                           (in_stack_fffffffffffff900,bVar12);
      if ((bool)local_f1) {
        local_118 = sv((char *)in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
        SmallVectorBase<char>::append_range<std::basic_string_view<char,_std::char_traits<char>_>_>
                  ((SmallVectorBase<char> *)in_stack_fffffffffffff8e0._M_extent_value,
                   in_stack_fffffffffffff8d8);
        std::basic_string_view<char,_std::char_traits<char>_>::size(&local_f0);
        bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                           in_stack_fffffffffffff8e0._M_extent_value);
        local_128 = bVar9;
        bVar12 = local_148;
        local_f0 = bVar9;
      }
      else {
        local_138 = sv((char *)in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
        SmallVectorBase<char>::append_range<std::basic_string_view<char,_std::char_traits<char>_>_>
                  ((SmallVectorBase<char> *)in_stack_fffffffffffff8e0._M_extent_value,
                   in_stack_fffffffffffff8d8);
        std::basic_string_view<char,_std::char_traits<char>_>::size(&local_f0);
        bVar12 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                            in_stack_fffffffffffff8e0._M_extent_value);
        local_f0 = bVar12;
      }
      local_148 = bVar12;
      SmallVectorBase<char>::append_range<std::basic_string_view<char,_std::char_traits<char>_>_>
                ((SmallVectorBase<char> *)in_stack_fffffffffffff8e0._M_extent_value,
                 in_stack_fffffffffffff8d8);
      if ((local_f1 & 1) == 0) {
        local_168 = sv((char *)in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
        SmallVectorBase<char>::append_range<std::basic_string_view<char,_std::char_traits<char>_>_>
                  ((SmallVectorBase<char> *)in_stack_fffffffffffff8e0._M_extent_value,
                   in_stack_fffffffffffff8d8);
      }
      else {
        local_158 = sv((char *)in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
        SmallVectorBase<char>::append_range<std::basic_string_view<char,_std::char_traits<char>_>_>
                  ((SmallVectorBase<char> *)in_stack_fffffffffffff8e0._M_extent_value,
                   in_stack_fffffffffffff8d8);
      }
    }
    else if ((short)local_c8 != 0x15e) {
      sVar8 = Token::rawText((Token *)in_stack_fffffffffffff8e0._M_extent_value);
      local_178 = sVar8;
      SmallVectorBase<char>::append_range<std::basic_string_view<char,_std::char_traits<char>_>_>
                ((SmallVectorBase<char> *)in_stack_fffffffffffff8e0._M_extent_value,
                 in_stack_fffffffffffff8d8);
    }
    __gnu_cxx::
    __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
    ::operator++(&local_b0);
  }
  bVar2 = Token::operator_cast_to_bool((Token *)0x67ba54);
  if (bVar2) {
    cur_01.info = in_stack_fffffffffffff920;
    cur_01._0_8_ = in_stack_fffffffffffff918;
    stringify::anon_class_16_2_0e293a20::operator()(in_stack_fffffffffffff910,cur_01);
  }
  if ((local_8d[0] & 1) != 0) {
    local_189 = 0x22;
    SmallVectorBase<char>::push_back
              ((SmallVectorBase<char> *)in_stack_fffffffffffff8d0,(char *)in_stack_fffffffffffff8c8)
    ;
    local_18a = 0x22;
    SmallVectorBase<char>::push_back
              ((SmallVectorBase<char> *)in_stack_fffffffffffff8d0,(char *)in_stack_fffffffffffff8c8)
    ;
  }
  local_18b = 0x22;
  SmallVectorBase<char>::push_back
            ((SmallVectorBase<char> *)in_stack_fffffffffffff8d0,(char *)in_stack_fffffffffffff8c8);
  local_18c = 0;
  SmallVectorBase<char>::push_back
            ((SmallVectorBase<char> *)in_stack_fffffffffffff8d0,(char *)in_stack_fffffffffffff8c8);
  iVar3 = SmallVectorBase<char>::copy(local_78,(EVP_PKEY_CTX *)*local_38,src);
  local_1b0 = CONCAT44(extraout_var,iVar3);
  text_00._M_extent._M_extent_value = in_stack_fffffffffffff8e0._M_extent_value;
  text_00._M_ptr = (pointer)in_stack_fffffffffffff8d8;
  sVar10 = toStringView(text_00);
  local_1a0 = sVar10;
  Diagnostics::Diagnostics((Diagnostics *)0x67bbc4);
  BVar4 = BufferID::getPlaceholder();
  local_594 = BVar4.id;
  local_5a8 = local_1a0;
  pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_1a0);
  bufferId.id = (uint32_t)((ulong)*local_38 >> 0x20);
  this = (Lexer *)local_38[0x5c];
  LexerOptions::LexerOptions(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
  sVar8._M_str = pvVar6;
  sVar8._M_len = in_stack_fffffffffffff930;
  Lexer(in_stack_fffffffffffff928,bufferId,sVar8,(char *)in_stack_fffffffffffff920,
        in_stack_fffffffffffff918,(Diagnostics *)CONCAT44(BVar4.id,in_stack_fffffffffffff950),
        (SourceManager *)sVar10._M_str,(LexerOptions *)sVar10._M_len);
  LexerOptions::~LexerOptions((LexerOptions *)0x67bc97);
  local_5f8[0] = lex(this);
  __fn = (__fn *)*local_38;
  sVar11 = Token::trivia(in_stack_fffffffffffff8f0);
  std::basic_string_view<char,_std::char_traits<char>_>::length(&local_1a0);
  bVar12 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                     ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8f0,
                      in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0._M_extent_value);
  SVar7 = Token::location(&local_20);
  iVar3 = Token::clone(local_5f8,__fn,sVar11._M_ptr,(int)sVar11._M_extent._M_extent_value,
                       (void *)bVar12._M_len,bVar12._M_str,SVar7);
  local_10 = CONCAT44(extraout_var_00,iVar3);
  local_8 = extraout_RDX;
  ~Lexer(this);
  Diagnostics::~Diagnostics((Diagnostics *)0x67be04);
  SmallVector<char,_40UL>::~SmallVector((SmallVector<char,_40UL> *)0x67be11);
  TVar1.info = local_8;
  TVar1.kind = (undefined2)local_10;
  TVar1._2_1_ = local_10._2_1_;
  TVar1.numFlags.raw = local_10._3_1_;
  TVar1.rawLen = local_10._4_4_;
  return TVar1;
}

Assistant:

Token Lexer::stringify(Lexer& parentLexer, Token startToken, std::span<Token> bodyTokens,
                       Token endToken) {
    SmallVector<char> text;
    text.push_back('"');

    const bool tripleQuoted = startToken.kind == TokenKind::MacroTripleQuote;
    if (tripleQuoted) {
        text.push_back('"');
        text.push_back('"');
    }

    auto addTrivia = [&](Token cur) {
        for (const Trivia& t : cur.trivia()) {
            if (t.kind == TriviaKind::Whitespace ||
                (tripleQuoted && t.kind == TriviaKind::EndOfLine)) {
                text.append_range(t.getRawText());
            }
        }
    };

    for (auto cur : bodyTokens) {
        addTrivia(cur);

        if (cur.kind == TokenKind::MacroEscapedQuote) {
            text.push_back('\\');
            text.push_back('"');
        }
        else if (cur.kind == TokenKind::StringLiteral) {
            auto raw = cur.rawText();
            const bool nestedHasTriple = raw.starts_with("\"\"\""sv);
            if (nestedHasTriple) {
                text.append_range(R"(\"\"\")"sv);
                raw = raw.substr(3, raw.size() - 6);
            }
            else {
                text.append_range(R"(\")"sv);
                raw = raw.substr(1, raw.size() - 2);
            }

            text.append_range(raw);

            if (nestedHasTriple)
                text.append_range(R"(\"\"\")"sv);
            else
                text.append_range(R"(\")"sv);
        }
        else if (cur.kind != TokenKind::EmptyMacroArgument) {
            text.append_range(cur.rawText());
        }
    }

    if (endToken)
        addTrivia(endToken);

    if (tripleQuoted) {
        text.push_back('"');
        text.push_back('"');
    }

    text.push_back('"');
    text.push_back('\0');

    std::string_view raw = toStringView(text.copy(parentLexer.alloc));

    Diagnostics unused;
    Lexer lexer{BufferID::getPlaceholder(), raw,    raw.data(),
                parentLexer.alloc,          unused, parentLexer.sourceManager,
                parentLexer.options};

    auto token = lexer.lex();
    SLANG_ASSERT(token.kind == TokenKind::StringLiteral);
    SLANG_ASSERT(lexer.lex().kind == TokenKind::EndOfFile);

    return token.clone(parentLexer.alloc, startToken.trivia(), raw.substr(0, raw.length() - 1),
                       startToken.location());
}